

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::SingleVertexArrayUsageTests::init
          (SingleVertexArrayUsageTests *this,EVP_PKEY_CTX *ctx)

{
  Usage usage_;
  GLValue min_;
  GLValue max_;
  int iVar1;
  int iVar2;
  MultiVertexArrayTest *this_00;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  InputType type;
  GLValue GVar7;
  GLValue GVar8;
  undefined4 uStack_d4;
  undefined4 uStack_c4;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
          if (lVar5 == 1) {
            type = (&DAT_01813c00)[lVar3];
            iVar1 = deqp::gls::Array::inputTypeSize(type);
            iVar1 = iVar1 * 2;
          }
          else {
            iVar1 = (&DAT_01813c30)[lVar5];
            type = (&DAT_01813c00)[lVar3];
          }
          iVar2 = deqp::gls::Array::inputTypeSize(type);
          usage_ = *(Usage *)((long)&DAT_017f9d0c + lVar6);
          GVar7 = deqp::gls::GLValue::getMinValue(type);
          GVar8 = deqp::gls::GLValue::getMaxValue(type);
          max_._4_4_ = uStack_d4;
          max_.type = GVar8.type;
          min_._4_4_ = uStack_c4;
          min_.type = GVar7.type;
          min_.field_1 = GVar7.field_1;
          max_.field_1 = GVar8.field_1;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    (&arraySpec,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,usage_,2,0,iVar1,false,min_,max_
                    );
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          spec.primitive = PRIMITIVE_TRIANGLES;
          spec.drawCount = (&DAT_01813e00)[lVar4];
          spec.first = 0;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::push_back(&spec.arrays,&arraySpec);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&name,&spec);
          if (iVar1 % iVar2 == 0) {
            this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                               m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,&spec,
                       name._M_dataplus._M_p,name._M_dataplus._M_p);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          }
          std::__cxx11::string::~string((string *)&name);
          std::
          _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::~_Vector_base(&spec.arrays.
                           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         );
        }
      }
    }
  }
  return 4;
}

Assistant:

void SingleVertexArrayUsageTests::init (void)
{
	// Test usage
	Array::Usage		usages[]		= {Array::USAGE_STATIC_DRAW, Array::USAGE_STREAM_DRAW, Array::USAGE_DYNAMIC_DRAW};
	int					counts[]		= {1, 256};
	int					strides[]		= {0, -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_FIXED, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
				{
					const int	componentCount	= 2;
					const int	stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * componentCount : strides[strideNdx]);
					const bool	aligned			= (stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0;
					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	usages[usageNdx],
																	componentCount,
																	0,
																	stride,
																	false,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();

					if (aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}